

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_NurbsCage *src)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  double *local_38;
  double *cv;
  int local_28;
  int k;
  int j;
  int i;
  int sizeofcv;
  int cv_dim;
  ON_NurbsCage *src_local;
  ON_NurbsCage *this_local;
  
  if (this != src) {
    ON_Geometry::operator=(&this->super_ON_Geometry,&src->super_ON_Geometry);
    bVar2 = Create(this,src->m_dim,(bool)(src->m_is_rat & 1),src->m_order[0],src->m_order[1],
                   src->m_order[2],src->m_cv_count[0],src->m_cv_count[1],src->m_cv_count[2]);
    if (bVar2) {
      if ((((1 < this->m_order[0]) && (this->m_order[0] <= this->m_cv_count[0])) &&
          (this->m_knot[0] != (double *)0x0)) && (src->m_knot[0] != (double *)0x0)) {
        pdVar4 = this->m_knot[0];
        pdVar1 = src->m_knot[0];
        iVar3 = KnotCount(this,0);
        memcpy(pdVar4,pdVar1,(long)iVar3 << 3);
      }
      if (((1 < this->m_order[1]) && (this->m_order[1] <= this->m_cv_count[1])) &&
         ((this->m_knot[1] != (double *)0x0 && (src->m_knot[1] != (double *)0x0)))) {
        pdVar4 = this->m_knot[1];
        pdVar1 = src->m_knot[1];
        iVar3 = KnotCount(this,1);
        memcpy(pdVar4,pdVar1,(long)iVar3 << 3);
      }
      if (((1 < this->m_order[2]) && (this->m_order[2] <= this->m_cv_count[2])) &&
         ((this->m_knot[2] != (double *)0x0 && (src->m_knot[2] != (double *)0x0)))) {
        pdVar4 = this->m_knot[2];
        pdVar1 = src->m_knot[2];
        iVar3 = KnotCount(this,2);
        memcpy(pdVar4,pdVar1,(long)iVar3 << 3);
      }
      if ((((this->m_cv != (double *)0x0) && (src->m_cv != (double *)0x0)) &&
          (0 < this->m_cv_stride[0])) && ((0 < this->m_cv_stride[1] && (0 < this->m_cv_stride[2]))))
      {
        iVar3 = CVSize(this);
        if ((this->m_cv_stride[0] == src->m_cv_stride[0]) &&
           ((this->m_cv_stride[1] == src->m_cv_stride[1] &&
            (this->m_cv_stride[2] == src->m_cv_stride[2])))) {
          memcpy(this->m_cv,src->m_cv,
                 (long)(this->m_cv_count[0] * this->m_cv_count[1] * this->m_cv_count[2] * iVar3 * 8)
                );
        }
        else {
          local_38 = this->m_cv;
          for (k = 0; k < this->m_cv_count[0]; k = k + 1) {
            for (local_28 = 0; local_28 < this->m_cv_count[1]; local_28 = local_28 + 1) {
              for (cv._4_4_ = 0; cv._4_4_ < this->m_cv_count[2]; cv._4_4_ = cv._4_4_ + 1) {
                pdVar4 = CV(src,k,local_28,cv._4_4_);
                memcpy(local_38,pdVar4,(long)(iVar3 * 8));
                local_38 = local_38 + iVar3;
              }
            }
          }
        }
      }
    }
    else {
      Destroy(this);
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=(const ON_NurbsCage& src)
{
  if ( this != &src ) 
  {
    ON_Geometry::operator=(src);
    if ( Create( src.m_dim, src.m_is_rat, 
         src.m_order[0], src.m_order[1], src.m_order[2],
         src.m_cv_count[0], src.m_cv_count[1], src.m_cv_count[2]
         ) )
    {
      if ( m_order[0] >= 2 && m_cv_count[0] >= m_order[0] && m_knot[0] && src.m_knot[0] )
        memcpy( m_knot[0], src.m_knot[0], KnotCount(0)*sizeof(m_knot[0][0]));
      if ( m_order[1] >= 2 && m_cv_count[1] >= m_order[1] && m_knot[1] && src.m_knot[1]  )
        memcpy( m_knot[1], src.m_knot[1], KnotCount(1)*sizeof(m_knot[1][0]));
      if ( m_order[2] >= 2 && m_cv_count[2] >= m_order[2] && m_knot[2] && src.m_knot[2]  )
        memcpy( m_knot[2], src.m_knot[2], KnotCount(2)*sizeof(m_knot[2][0]));

      if ( m_cv && src.m_cv && m_cv_stride[0] > 0 && m_cv_stride[1] > 0 && m_cv_stride[2] > 0 )
      {
        const int cv_dim = CVSize();
        const int sizeofcv = cv_dim*sizeof(m_cv[0]);
        if (    m_cv_stride[0] == src.m_cv_stride[0] 
            && m_cv_stride[1] == src.m_cv_stride[1]
            && m_cv_stride[2] == src.m_cv_stride[2] )
        {
          memcpy(m_cv,src.m_cv,m_cv_count[0]*m_cv_count[1]*m_cv_count[2]*sizeofcv);
        }
        else
        {
          int i, j, k;
          double* cv = m_cv;
          for ( i = 0; i < m_cv_count[0]; i++ ) 
          for ( j = 0; j < m_cv_count[1]; j++ ) 
          for ( k = 0; k < m_cv_count[2]; k++ ) 
          {
            memcpy( cv, src.CV(i,j,k), sizeofcv );
            cv += cv_dim;
          }
        }
      }
    }
    else 
    {
      Destroy();
    }
  }
  return *this;
}